

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x86emithelper.cpp
# Opt level: O1

Error asmjit::v1_14::x86::X86Internal_setupSaveRestoreInfo
                (RegGroup group,FuncFrame *frame,Reg *xReg,uint32_t *xInst,uint32_t *xSize)

{
  uint32_t uVar1;
  int iVar2;
  uint32_t uVar3;
  undefined7 in_register_00000039;
  bool bVar4;
  
  iVar2 = (int)CONCAT71(in_register_00000039,group);
  if (iVar2 == 3) {
    (xReg->super_BaseReg).super_Operand.super_Operand_._signature = 0x8000391;
    (xReg->super_BaseReg).super_Operand.super_Operand_._baseId = 0;
    (xReg->super_BaseReg).super_Operand.super_Operand_._data[0] = 0;
    (xReg->super_BaseReg).super_Operand.super_Operand_._data[1] = 0;
    uVar1 = 0x1d3;
  }
  else if (iVar2 == 2) {
    (xReg->super_BaseReg).super_Operand.super_Operand_._signature = 0x289;
    (xReg->super_BaseReg).super_Operand.super_Operand_._baseId = 0;
    (xReg->super_BaseReg).super_Operand.super_Operand_._data[0] = 0;
    (xReg->super_BaseReg).super_Operand.super_Operand_._data[1] = 0;
    uVar1 = 0x167;
  }
  else {
    if (iVar2 != 1) {
      return 3;
    }
    (xReg->super_BaseReg).super_Operand.super_Operand_._signature = 0x10000161;
    (xReg->super_BaseReg).super_Operand.super_Operand_._baseId = 0;
    (xReg->super_BaseReg).super_Operand.super_Operand_._data[0] = 0;
    (xReg->super_BaseReg).super_Operand.super_Operand_._data[1] = 0;
    bVar4 = (frame->_attributes >> 0x10 & 1) == 0;
    uVar3 = 0x4a9;
    if (bVar4) {
      uVar3 = 0x1ba;
    }
    uVar1 = 0x4c7;
    if (bVar4) {
      uVar1 = 0x1dd;
    }
    if ((frame->_attributes & kAlignedVecSR) != kNoAttributes) {
      uVar1 = uVar3;
    }
  }
  *xInst = uVar1;
  *xSize = (uint)*(byte *)((long)&(xReg->super_BaseReg).super_Operand.super_Operand_._signature.
                                  _bits + 3);
  return 0;
}

Assistant:

static inline Error X86Internal_setupSaveRestoreInfo(RegGroup group, const FuncFrame& frame, Reg& xReg, uint32_t& xInst, uint32_t& xSize) noexcept {
  switch (group) {
    case RegGroup::kVec:
      xReg = xmm(0);
      xInst = getXmmMovInst(frame);
      xSize = xReg.size();
      return kErrorOk;

    case RegGroup::kX86_K:
      xReg = k(0);
      xInst = Inst::kIdKmovq;
      xSize = xReg.size();
      return kErrorOk;

    case RegGroup::kX86_MM:
      xReg = mm(0);
      xInst = Inst::kIdMovq;
      xSize = xReg.size();
      return kErrorOk;

    default:
      // This would be a bug in AsmJit if hit.
      return DebugUtils::errored(kErrorInvalidState);
  }
}